

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase747::run(TestCase747 *this)

{
  StructDataBitCount *this_00;
  initializer_list<bool> list;
  bool bVar1;
  Type *func;
  Type *func_00;
  bool local_471;
  undefined1 *puStack_470;
  bool _kj_shouldLog_1;
  undefined1 local_468 [8];
  Maybe<kj::Exception> e_1;
  Reader reader;
  undefined1 *puStack_2d0;
  bool _kj_shouldLog;
  undefined1 local_2c8 [8];
  Maybe<kj::Exception> e;
  Builder local_150;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase747 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_150,(Builder *)local_128);
  e.ptr.field_1._340_1_ = 1;
  e.ptr.field_1._341_1_ = 0;
  e.ptr.field_1._342_1_ = 1;
  e.ptr.field_1._343_1_ = 1;
  list._M_len = 4;
  list._M_array = (iterator)((long)&e.ptr.field_1 + 0x154);
  AnyPointer::Builder::setAs<capnp::List<bool,(capnp::Kind)0>>(&local_150,list);
  puStack_2d0 = local_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase747::run()::__0>
            ((Maybe<kj::Exception> *)local_2c8,(kj *)&stack0xfffffffffffffd30,func);
  bVar1 = kj::Maybe<kj::Exception>::operator!=((Maybe<kj::Exception> *)local_2c8,(void *)0x0);
  if (!bVar1) {
    reader._reader._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (reader._reader._47_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[30],char_const(&)[33]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2fb,ERROR,
                 "\"failed: expected \" \"e != nullptr\", \"Should have thrown an exception.\"",
                 (char (*) [30])"failed: expected e != nullptr",
                 (char (*) [33])"Should have thrown an exception.");
      reader._reader._47_1_ = 0;
    }
  }
  kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)local_2c8);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader
            ((Reader *)((long)&e_1.ptr.field_1 + 0x150),(Builder *)local_128);
  puStack_470 = (undefined1 *)((long)&e_1.ptr.field_1 + 0x150);
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase747::run()::__1>
            ((Maybe<kj::Exception> *)local_468,(kj *)&stack0xfffffffffffffb90,func_00);
  bVar1 = kj::Maybe<kj::Exception>::operator!=((Maybe<kj::Exception> *)local_468,(void *)0x0);
  if (!bVar1) {
    local_471 = kj::_::Debug::shouldLog(ERROR);
    while (local_471 != false) {
      kj::_::Debug::log<char_const(&)[30],char_const(&)[33]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x308,ERROR,
                 "\"failed: expected \" \"e != nullptr\", \"Should have thrown an exception.\"",
                 (char (*) [30])"failed: expected e != nullptr",
                 (char (*) [33])"Should have thrown an exception.");
      local_471 = false;
    }
  }
  kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)local_468);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, BitListUpgrade) {
  // No longer supported!

  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().setAs<List<bool>>({true, false, true, true});

  {
    kj::Maybe<kj::Exception> e = kj::runCatchingExceptions([&]() {
      root.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
#if !KJ_NO_EXCEPTIONS
      ADD_FAILURE() << "Should have thrown an exception.";
#endif
    });

    KJ_EXPECT(e != nullptr, "Should have thrown an exception.");
  }

  auto reader = root.asReader();

  {
    kj::Maybe<kj::Exception> e = kj::runCatchingExceptions([&]() {
      reader.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
#if !KJ_NO_EXCEPTIONS
      ADD_FAILURE() << "Should have thrown an exception.";
#endif
    });

    KJ_EXPECT(e != nullptr, "Should have thrown an exception.");
  }
}